

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_handle_pCAL(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  png_bytep buf;
  ulong uVar5;
  long lVar6;
  png_charpp params;
  ulong uVar7;
  uint X0;
  char *error_message;
  uint X1;
  byte *pbVar8;
  byte *pbVar9;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) != 0) {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
    goto LAB_0011a584;
  }
  if ((info_ptr != (png_inforp)0x0) && ((info_ptr->valid & 0x400) != 0)) {
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
    goto LAB_0011a584;
  }
  buf = png_read_buffer(png_ptr,(ulong)(length + 1),2);
  if (buf == (png_bytep)0x0) {
    png_crc_finish(png_ptr,length);
LAB_0011a459:
    error_message = "out of memory";
  }
  else {
    png_crc_read(png_ptr,buf,length);
    iVar4 = png_crc_finish(png_ptr,0);
    if (iVar4 != 0) {
      return;
    }
    uVar5 = (ulong)length;
    buf[uVar5] = '\0';
    lVar6 = uVar5 + 1;
    pbVar9 = buf + 9;
    do {
      pbVar8 = pbVar9;
      lVar6 = lVar6 + -1;
      pbVar9 = pbVar8 + 1;
    } while (pbVar8[-9] != 0);
    if (lVar6 < 0xd) {
      error_message = "invalid";
      goto LAB_0011a584;
    }
    bVar2 = pbVar8[-8];
    if ((char)bVar2 < '\0') {
      X0 = -((uint)pbVar8[-7] * 0x7fff0000 -
             ((uint)pbVar8[-5] | (uint)pbVar8[-6] << 8 | (uint)bVar2 << 0x18) & 0x7fffffff);
    }
    else {
      X0 = (uint)pbVar8[-5] | (uint)pbVar8[-6] << 8 | (uint)pbVar8[-7] << 0x10 | (uint)bVar2 << 0x18
      ;
    }
    bVar2 = pbVar8[-4];
    if ((char)bVar2 < '\0') {
      X1 = -((uint)pbVar8[-3] * 0x7fff0000 -
             ((uint)pbVar8[-1] | (uint)pbVar8[-2] << 8 | (uint)bVar2 << 0x18) & 0x7fffffff);
    }
    else {
      X1 = (uint)pbVar8[-1] | (uint)pbVar8[-2] << 8 | (uint)pbVar8[-3] << 0x10 | (uint)bVar2 << 0x18
      ;
    }
    bVar2 = *pbVar8;
    bVar3 = *pbVar9;
    if ((bVar2 != 0 || bVar3 == 2) && ((1 < (byte)(bVar2 - 1) || (bVar3 == 3)))) {
      if (bVar3 == 4 || bVar2 != 3) {
        if (3 < bVar2) {
          png_chunk_benign_error(png_ptr,"unrecognized equation type");
        }
        do {
          pbVar1 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
        } while (*pbVar1 != 0);
        params = (png_charpp)png_malloc_warn(png_ptr,(ulong)((uint)bVar3 * 8));
        if (params != (png_charpp)0x0) {
          if ((ulong)bVar3 != 0) {
            uVar7 = 0;
            do {
              pbVar9 = pbVar9 + 1;
              params[uVar7] = (char *)pbVar9;
              while( true ) {
                if (buf + uVar5 < pbVar9) {
                  png_free(png_ptr,params);
                  error_message = "invalid data";
                  goto LAB_0011a584;
                }
                if (*pbVar9 == 0) break;
                pbVar9 = pbVar9 + 1;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != bVar3);
          }
          png_set_pCAL(png_ptr,info_ptr,(png_const_charp)buf,X0,X1,(uint)bVar2,(uint)bVar3,
                       (png_const_charp)(pbVar8 + 2),params);
          png_free(png_ptr,params);
          return;
        }
        goto LAB_0011a459;
      }
    }
    error_message = "invalid parameter count";
  }
LAB_0011a584:
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_pCAL(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_int_32 X0, X1;
   png_byte type, nparams;
   png_bytep buffer, buf, units, endptr;
   png_charpp params;
   int i;

   png_debug(1, "in png_handle_pCAL");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_pCAL) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   png_debug1(2, "Allocating and reading pCAL chunk data (%u bytes)",
       length + 1);

   buffer = png_read_buffer(png_ptr, length+1, 2/*silent*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   buffer[length] = 0; /* Null terminate the last string */

   png_debug(3, "Finding end of pCAL purpose string");
   for (buf = buffer; *buf; buf++)
      /* Empty loop */ ;

   endptr = buffer + length;

   /* We need to have at least 12 bytes after the purpose string
    * in order to get the parameter information.
    */
   if (endptr - buf <= 12)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_debug(3, "Reading pCAL X0, X1, type, nparams, and units");
   X0 = png_get_int_32((png_bytep)buf+1);
   X1 = png_get_int_32((png_bytep)buf+5);
   type = buf[9];
   nparams = buf[10];
   units = buf + 11;

   png_debug(3, "Checking pCAL equation type and number of parameters");
   /* Check that we have the right number of parameters for known
    * equation types.
    */
   if ((type == PNG_EQUATION_LINEAR && nparams != 2) ||
       (type == PNG_EQUATION_BASE_E && nparams != 3) ||
       (type == PNG_EQUATION_ARBITRARY && nparams != 3) ||
       (type == PNG_EQUATION_HYPERBOLIC && nparams != 4))
   {
      png_chunk_benign_error(png_ptr, "invalid parameter count");
      return;
   }

   else if (type >= PNG_EQUATION_LAST)
   {
      png_chunk_benign_error(png_ptr, "unrecognized equation type");
   }

   for (buf = units; *buf; buf++)
      /* Empty loop to move past the units string. */ ;

   png_debug(3, "Allocating pCAL parameters array");

   params = png_voidcast(png_charpp, png_malloc_warn(png_ptr,
       nparams * (sizeof (png_charp))));

   if (params == NULL)
   {
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   /* Get pointers to the start of each parameter string. */
   for (i = 0; i < nparams; i++)
   {
      buf++; /* Skip the null string terminator from previous parameter. */

      png_debug1(3, "Reading pCAL parameter %d", i);

      for (params[i] = (png_charp)buf; buf <= endptr && *buf != 0; buf++)
         /* Empty loop to move past each parameter string */ ;

      /* Make sure we haven't run out of data yet */
      if (buf > endptr)
      {
         png_free(png_ptr, params);
         png_chunk_benign_error(png_ptr, "invalid data");
         return;
      }
   }

   png_set_pCAL(png_ptr, info_ptr, (png_charp)buffer, X0, X1, type, nparams,
       (png_charp)units, params);

   png_free(png_ptr, params);
}